

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseImporter.cpp
# Opt level: O0

aiScene * __thiscall Assimp::BatchLoader::GetImport(BatchLoader *this,uint which)

{
  BatchData *pBVar1;
  bool bVar2;
  uint uVar3;
  reference pLVar4;
  const_iterator local_40;
  aiScene *local_38;
  aiScene *sc;
  _Self local_28;
  LoadReqIt it;
  uint which_local;
  BatchLoader *this_local;
  
  it._M_node._4_4_ = which;
  local_28._M_node =
       (_List_node_base *)
       std::__cxx11::list<Assimp::LoadRequest,_std::allocator<Assimp::LoadRequest>_>::begin
                 (&this->m_data->requests);
  while( true ) {
    sc = (aiScene *)
         std::__cxx11::list<Assimp::LoadRequest,_std::allocator<Assimp::LoadRequest>_>::end
                   (&this->m_data->requests);
    bVar2 = std::operator!=(&local_28,(_Self *)&sc);
    if (!bVar2) {
      return (aiScene *)0x0;
    }
    pLVar4 = std::_List_iterator<Assimp::LoadRequest>::operator*(&local_28);
    if ((pLVar4->id == it._M_node._4_4_) &&
       (pLVar4 = std::_List_iterator<Assimp::LoadRequest>::operator*(&local_28),
       (pLVar4->loaded & 1U) != 0)) break;
    std::_List_iterator<Assimp::LoadRequest>::operator++(&local_28);
  }
  pLVar4 = std::_List_iterator<Assimp::LoadRequest>::operator*(&local_28);
  local_38 = pLVar4->scene;
  pLVar4 = std::_List_iterator<Assimp::LoadRequest>::operator*(&local_28);
  uVar3 = pLVar4->refCnt - 1;
  pLVar4->refCnt = uVar3;
  if (uVar3 == 0) {
    pBVar1 = this->m_data;
    std::_List_const_iterator<Assimp::LoadRequest>::_List_const_iterator(&local_40,&local_28);
    std::__cxx11::list<Assimp::LoadRequest,_std::allocator<Assimp::LoadRequest>_>::erase
              (&pBVar1->requests,local_40);
  }
  return local_38;
}

Assistant:

aiScene* BatchLoader::GetImport( unsigned int which )
{
    for ( LoadReqIt it = m_data->requests.begin();it != m_data->requests.end(); ++it) {
        if ((*it).id == which && (*it).loaded)  {
            aiScene* sc = (*it).scene;
            if (!(--(*it).refCnt))  {
                m_data->requests.erase(it);
            }
            return sc;
        }
    }
    return nullptr;
}